

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O2

void __thiscall
diy::AMRLink::AMRLink(AMRLink *this,int dim,int level,Point *refinement,Bounds *core,Bounds *bounds)

{
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_160;
  Bounds<int> local_120;
  Bounds<int> local_a0;
  
  (this->super_Registrar<diy::AMRLink>).super_Link.neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_Registrar<diy::AMRLink>).super_Link.neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_Registrar<diy::AMRLink>).super_Link.neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_Registrar<diy::AMRLink>).super_Link.super_Factory<diy::Link>._vptr_Factory =
       (_func_int **)&PTR_id_abi_cxx11__001c3bb8;
  this->dim_ = dim;
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
            (&local_160,&refinement->super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>);
  Bounds<int>::Bounds(&local_a0,core);
  Bounds<int>::Bounds(&local_120,bounds);
  Description::Description(&this->local_,level,(Point *)&local_160,&local_a0,&local_120);
  Bounds<int>::~Bounds(&local_120);
  Bounds<int>::~Bounds(&local_a0);
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::~small_vector(&local_160);
  (this->wrap_).super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->wrap_).super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nbr_descriptions_).
  super__Vector_base<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->wrap_).super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nbr_descriptions_).
  super__Vector_base<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nbr_descriptions_).
  super__Vector_base<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

AMRLink(int dim, int level, Point refinement, const Bounds& core, const Bounds& bounds):
                        dim_(dim), local_ { level, refinement, core, bounds }               {}